

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void icetStateCheckMemory(void)

{
  return;
}

Assistant:

void icetStateCheckMemory(void)
{
#ifdef ICET_STATE_CHECK_MEM
    IceTState state = icetGetState();
    IceTEnum pname;

    for (pname = ICET_STATE_ENGINE_START;
         pname < ICET_STATE_ENGINE_END;
         pname++) {
        stateCheck(pname, state);
    }
#endif
}